

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void jmp_ensure_false_falls_through(Parser *psr,Node *node)

{
  int iVar1;
  BcIns *pBVar2;
  BcOp BVar3;
  int iVar4;
  Function *pFVar5;
  int tmp;
  BcOp inverted;
  BcIns *cond;
  Node *node_local;
  Parser *psr_local;
  
  if ((node->field_1).reloc_idx < (node->field_1).jmp.false_list) {
    pFVar5 = psr_fn(psr);
    pBVar2 = pFVar5->ins;
    iVar1 = (node->field_1).jmp.false_list;
    BVar3 = bc_op(pBVar2[iVar1 + -1]);
    BVar3 = relop_invert(BVar3);
    bc_set_op(pBVar2 + (iVar1 + -1),BVar3);
    iVar1 = (node->field_1).jmp.false_list;
    iVar4 = jmp_follow(psr,(node->field_1).jmp.false_list);
    (node->field_1).jmp.false_list = iVar4;
    jmp_list_append(psr,&(node->field_1).reloc_idx,iVar1);
  }
  return;
}

Assistant:

static void jmp_ensure_false_falls_through(Parser *psr, Node *node) {
	// Note `true_list` and `false_list` point to the JMP instruction with the
	// LARGEST PC in the true and false case jump lists. Thus if the false list
	// comes last, then the true case must fall through. We don't want this -
	// we want the false case to fall through - so invert the last instruction.
	if (node->jmp.false_list > node->jmp.true_list) {
		// Invert the condition
		BcIns *cond = &psr_fn(psr)->ins[node->jmp.false_list - 1];
		BcOp inverted = relop_invert(bc_op(*cond));
		bc_set_op(cond, inverted);

		// Remove this particular jump from the false list
		int tmp = node->jmp.false_list;
		node->jmp.false_list = jmp_follow(psr, node->jmp.false_list);

		// Add the jump to the true list
		jmp_list_append(psr, &node->jmp.true_list, tmp);
	}
}